

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall CTxMemPool::PrioritiseTransaction(CTxMemPool *this,uint256 *hash,CAmount *nFeeDelta)

{
  type *this_00;
  indexed_transaction_set *this_01;
  size_type *psVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  index_node_type *piVar4;
  bool bVar5;
  mapped_type *pmVar6;
  long lVar7;
  iterator x;
  CTxMemPool *pCVar8;
  _Base_ptr p_Var9;
  char *pcVar10;
  CTxMemPool *this_02;
  CTxMemPool *pCVar11;
  long in_FS_OFFSET;
  string_view calling_fn_name;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *local_d8;
  txiter it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  string local_b8;
  setEntries setDescendants;
  setEntries ancestors;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock13,&this->cs,"cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
             ,0x370,false);
  pmVar6 = std::
           map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
           ::operator[](&this->mapDeltas,hash);
  lVar7 = SaturatingAdd<long>(*pmVar6,*nFeeDelta);
  *pmVar6 = lVar7;
  this_00 = &(this->mapTx).super_type;
  x = boost::multi_index::detail::
      hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
      ::find<uint256>(this_00,hash);
  it.node = x.node;
  if (x.node != (this->mapTx).
                super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                .member) {
    this_01 = &this->mapTx;
    CTxMemPoolEntry::UpdateModifiedFee((CTxMemPoolEntry *)x.node,*nFeeDelta);
    bVar5 = boost::multi_index::detail::
            hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
            ::modify_(this_00,x.node);
    if (!bVar5) {
      boost::multi_index::
      multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
      ::delete_node_(this_01,x.node);
      psVar1 = &(this->mapTx).node_count;
      *psVar1 = *psVar1 - 1;
    }
    setDescendants._M_t._M_impl._0_8_ = 0x7fffffffffffffff;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x7fffffff;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x7fffffffffffffff;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x7fffffffffffffff;
    this_02 = (CTxMemPool *)&ancestors;
    calling_fn_name._M_str = "PrioritiseTransaction";
    calling_fn_name._M_len = 0x15;
    AssumeCalculateMemPoolAncestors
              ((setEntries *)this_02,this,calling_fn_name,(CTxMemPoolEntry *)it.node,
               (Limits *)&setDescendants,false);
    pCVar11 = (CTxMemPool *)ancestors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pCVar11 != (CTxMemPool *)&ancestors._M_t._M_impl.super__Rb_tree_header) {
      piVar4 = (index_node_type *)pCVar11->lastRollingFeeUpdate;
      CTxMemPoolEntry::UpdateDescendantState((CTxMemPoolEntry *)piVar4,0,*nFeeDelta,0);
      bVar5 = boost::multi_index::detail::
              hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
              ::modify_(this_00,piVar4);
      if (!bVar5) {
        boost::multi_index::
        multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
        ::delete_node_(this_01,piVar4);
        psVar1 = &(this->mapTx).node_count;
        *psVar1 = *psVar1 - 1;
      }
      pCVar8 = (CTxMemPool *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar11);
      this_02 = pCVar11;
      pCVar11 = pCVar8;
    }
    p_Var2 = &setDescendants._M_t._M_impl.super__Rb_tree_header;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    CalculateDescendants(this_02,it,&setDescendants);
    std::_Rb_tree<$270907ca$>::erase(&setDescendants._M_t,&it);
    for (p_Var9 = setDescendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != p_Var2; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      piVar4 = *(index_node_type **)(p_Var9 + 1);
      CTxMemPoolEntry::UpdateAncestorState((CTxMemPoolEntry *)piVar4,0,*nFeeDelta,0,0);
      bVar5 = boost::multi_index::detail::
              hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
              ::modify_(this_00,piVar4);
      if (!bVar5) {
        boost::multi_index::
        multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
        ::delete_node_(this_01,piVar4);
        psVar1 = &(this->mapTx).node_count;
        *psVar1 = *psVar1 - 1;
      }
    }
    LOCK();
    (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i =
         (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    std::_Rb_tree<$270907ca$>::~_Rb_tree(&setDescendants._M_t);
    std::_Rb_tree<$270907ca$>::~_Rb_tree(&ancestors._M_t);
  }
  if (*pmVar6 == 0) {
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
    ::erase(&(this->mapDeltas)._M_t,hash);
    base_blob<256u>::ToString_abi_cxx11_((string *)&ancestors,(base_blob<256u> *)hash);
    pcVar10 = "";
    if (it.node ==
        (this->mapTx).
        super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
        .member) {
      pcVar10 = "not ";
    }
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
    ;
    source_file_00._M_len = 0x5d;
    logging_function_00._M_str = "PrioritiseTransaction";
    logging_function_00._M_len = 0x15;
    setDescendants._M_t._M_impl._0_8_ = pcVar10;
    LogPrintFormatInternal<std::__cxx11::string,char_const*>
              (logging_function_00,source_file_00,0x386,ALL,Info,(ConstevalFormatString<2U>)0xccff67
               ,(string *)&ancestors,(char **)&setDescendants);
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_((string *)&ancestors,(base_blob<256u> *)hash);
    local_d8 = "";
    if (it.node ==
        (this->mapTx).
        super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
        .member) {
      local_d8 = "not ";
    }
    FormatMoney_abi_cxx11_((string *)&setDescendants,*nFeeDelta);
    FormatMoney_abi_cxx11_(&local_b8,*pmVar6);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
    ;
    source_file._M_len = 0x5d;
    logging_function._M_str = "PrioritiseTransaction";
    logging_function._M_len = 0x15;
    LogPrintFormatInternal<std::__cxx11::string,char_const*,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x38c,ALL,Info,(ConstevalFormatString<4U>)0xccff9f,
               (string *)&ancestors,&local_d8,(string *)&setDescendants,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&setDescendants);
  }
  std::__cxx11::string::~string((string *)&ancestors);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::PrioritiseTransaction(const uint256& hash, const CAmount& nFeeDelta)
{
    {
        LOCK(cs);
        CAmount &delta = mapDeltas[hash];
        delta = SaturatingAdd(delta, nFeeDelta);
        txiter it = mapTx.find(hash);
        if (it != mapTx.end()) {
            mapTx.modify(it, [&nFeeDelta](CTxMemPoolEntry& e) { e.UpdateModifiedFee(nFeeDelta); });
            // Now update all ancestors' modified fees with descendants
            auto ancestors{AssumeCalculateMemPoolAncestors(__func__, *it, Limits::NoLimits(), /*fSearchForParents=*/false)};
            for (txiter ancestorIt : ancestors) {
                mapTx.modify(ancestorIt, [=](CTxMemPoolEntry& e){ e.UpdateDescendantState(0, nFeeDelta, 0);});
            }
            // Now update all descendants' modified fees with ancestors
            setEntries setDescendants;
            CalculateDescendants(it, setDescendants);
            setDescendants.erase(it);
            for (txiter descendantIt : setDescendants) {
                mapTx.modify(descendantIt, [=](CTxMemPoolEntry& e){ e.UpdateAncestorState(0, nFeeDelta, 0, 0); });
            }
            ++nTransactionsUpdated;
        }
        if (delta == 0) {
            mapDeltas.erase(hash);
            LogPrintf("PrioritiseTransaction: %s (%sin mempool) delta cleared\n", hash.ToString(), it == mapTx.end() ? "not " : "");
        } else {
            LogPrintf("PrioritiseTransaction: %s (%sin mempool) fee += %s, new delta=%s\n",
                      hash.ToString(),
                      it == mapTx.end() ? "not " : "",
                      FormatMoney(nFeeDelta),
                      FormatMoney(delta));
        }
    }
}